

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int target_get_address(TARGET_HANDLE target,AMQP_VALUE *address_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint32_t local_1c;
  
  if (target == (TARGET_HANDLE)0x0) {
    iVar3 = 0x35d4;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(target->composite_value,&local_1c);
    iVar3 = 0x35dc;
    if (iVar1 == 0) {
      if (local_1c == 0) {
        iVar3 = 0x35e2;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(target->composite_value,0);
        iVar3 = 0x35ea;
        if (value != (AMQP_VALUE)0x0) {
          AVar2 = amqpvalue_get_type(value);
          if (AVar2 != AMQP_TYPE_NULL) {
            *address_value = value;
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int target_get_address(TARGET_HANDLE target, AMQP_VALUE* address_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        if (amqpvalue_get_composite_item_count(target_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(target_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *address_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}